

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O0

void __thiscall
xLearn::FMScore::calc_grad_ftrl(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  index_t iVar19;
  pointer pNVar20;
  real_t *prVar21;
  real_t *prVar22;
  undefined1 (*pauVar23) [16];
  real_t *prVar24;
  uint uVar25;
  int iVar26;
  Model *in_RDX;
  long in_RDI;
  float in_XMM0_Da;
  real_t rVar27;
  float fVar28;
  double dVar29;
  double dVar30;
  float fVar32;
  float fVar33;
  undefined1 auVar31 [16];
  float fVar34;
  float in_XMM1_Da;
  int sign_2;
  real_t z_value;
  size_t i;
  __m128 XMMsigma;
  __m128 XMMg;
  __m128 XMMz;
  __m128 XMMwg;
  __m128 XMMw_1;
  __m128 XMMs_1;
  real_t *z;
  real_t *wg;
  real_t *w_2;
  index_t d_1;
  __m128 XMMpgv;
  __m128 XMMv_1;
  real_t *w_base;
  real_t v1_1;
  index_t j1_1;
  const_iterator iter_2;
  __m128 XMMw;
  __m128 XMMs;
  index_t d;
  __m128 XMMv;
  real_t *w_1;
  real_t v1;
  index_t j1;
  const_iterator iter_1;
  real_t *s;
  vector<float,_std::allocator<float>_> sv;
  __m128 XMML2;
  __m128 XMMalpha;
  __m128 XMMpg;
  index_t align0;
  index_t aligned_k;
  int sign;
  real_t sigma;
  real_t old_wbg;
  real_t g;
  real_t *wbz;
  real_t *wbg;
  real_t *wb;
  int sign_1;
  real_t sigma_1;
  real_t old_wlg;
  real_t g_1;
  real_t *wlz;
  real_t *wlg;
  real_t *wl;
  index_t feat_id;
  const_iterator iter;
  index_t num_feat;
  real_t *w;
  real_t sqrt_norm;
  undefined4 in_stack_fffffffffffff7a8;
  float in_stack_fffffffffffff7ac;
  float in_stack_fffffffffffff7b0;
  float in_stack_fffffffffffff7b4;
  undefined4 in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7bc;
  float in_stack_fffffffffffff7c0;
  float in_stack_fffffffffffff7c4;
  size_type in_stack_fffffffffffff7c8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff7d0;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_738;
  undefined8 uStack_730;
  ulong local_5c0;
  uint local_53c;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  uint local_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  real_t *local_4b0;
  float local_4a8;
  uint local_4a4;
  Node *local_4a0;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_498;
  float *local_490;
  undefined4 local_474;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  int local_420;
  index_t local_41c;
  int local_418;
  float local_414;
  real_t local_410;
  float local_40c;
  float *local_408;
  real_t *local_400;
  real_t *local_3f8;
  int local_3f0;
  float local_3ec;
  real_t local_3e8;
  uint local_3e4;
  float *local_3e0;
  real_t *local_3d8;
  real_t *local_3d0;
  uint local_3c4;
  Node *local_3c0;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_3b8;
  index_t local_3ac;
  real_t *local_3a8;
  float local_39c;
  float local_398;
  float local_394;
  Model *local_390;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_33c;
  undefined4 local_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 local_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2dc;
  real_t *local_2d8;
  undefined1 (*local_2d0) [16];
  real_t *local_2c8;
  undefined1 (*local_2c0) [16];
  real_t *local_2b8;
  float *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 (*local_f0) [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  real_t *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_398 = in_XMM1_Da;
  local_394 = in_XMM0_Da;
  local_390 = in_RDX;
  dVar29 = std::sqrt((double)(ulong)(uint)in_XMM1_Da);
  local_39c = SUB84(dVar29,0);
  local_3a8 = Model::GetParameter_w(local_390);
  local_3ac = Model::GetNumFeature(local_390);
  local_3b8._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                          CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  while( true ) {
    local_3c0 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                                   CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    bVar18 = __gnu_cxx::operator!=
                       ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                        (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    if (!bVar18) break;
    pNVar20 = __gnu_cxx::
              __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
              ::operator->(&local_3b8);
    fVar1 = local_394;
    local_3c4 = pNVar20->feat_id;
    if (local_3c4 < local_3ac) {
      local_3d0 = local_3a8 + local_3c4 * 3;
      local_3d8 = local_3a8 + (local_3c4 * 3 + 1);
      local_3e0 = local_3a8 + (local_3c4 * 3 + 2);
      uVar25 = *(uint *)(in_RDI + 0x1c);
      rVar27 = *local_3d0;
      pNVar20 = __gnu_cxx::
                __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                ::operator->(&local_3b8);
      auVar31 = vfmadd213ss_fma(ZEXT416((uint)rVar27),ZEXT416(uVar25),
                                ZEXT416((uint)(fVar1 * pNVar20->feat_val * local_39c)));
      local_3e4 = auVar31._0_4_;
      local_3e8 = *local_3d8;
      auVar31 = vfmadd213ss_fma(ZEXT416(local_3e4),ZEXT416(local_3e4),ZEXT416((uint)*local_3d8));
      *local_3d8 = auVar31._0_4_;
      dVar29 = std::sqrt((double)(ulong)(uint)*local_3d8);
      dVar30 = std::sqrt((double)(ulong)(uint)local_3e8);
      local_3ec = (SUB84(dVar29,0) - SUB84(dVar30,0)) / *(float *)(in_RDI + 0x10);
      auVar31 = vfmadd213ss_fma(ZEXT416((uint)*local_3d0),ZEXT416((uint)-local_3ec),
                                ZEXT416(local_3e4));
      *local_3e0 = auVar31._0_4_ + *local_3e0;
      local_3f0 = -1;
      if (0.0 < *local_3e0) {
        local_3f0 = 1;
      }
      if (*(float *)(in_RDI + 0x18) < (float)local_3f0 * *local_3e0) {
        auVar31 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDI + 0x18)),ZEXT416((uint)(float)local_3f0),
                                  ZEXT416((uint)-*local_3e0));
        fVar1 = *(float *)(in_RDI + 0x14);
        dVar29 = std::sqrt((double)(ulong)(uint)*local_3d8);
        *local_3d0 = auVar31._0_4_ /
                     ((fVar1 + SUB84(dVar29,0)) / *(float *)(in_RDI + 0x10) +
                     *(float *)(in_RDI + 0x1c));
      }
      else {
        *local_3d0 = 0.0;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_3b8);
  }
  local_3f8 = Model::GetParameter_b(local_390);
  local_400 = local_3f8 + 1;
  local_408 = local_3f8 + 2;
  local_40c = local_394;
  local_410 = *local_400;
  auVar31 = vfmadd213ss_fma(ZEXT416((uint)local_394),ZEXT416((uint)local_394),
                            ZEXT416((uint)*local_400));
  *local_400 = auVar31._0_4_;
  local_3a8 = local_3f8;
  dVar29 = std::sqrt((double)(ulong)(uint)*local_400);
  dVar30 = std::sqrt((double)(ulong)(uint)local_410);
  local_414 = (SUB84(dVar29,0) - SUB84(dVar30,0)) / *(float *)(in_RDI + 0x10);
  auVar31 = vfmadd213ss_fma(ZEXT416((uint)*local_3f8),ZEXT416((uint)-local_414),
                            ZEXT416((uint)local_40c));
  *local_408 = auVar31._0_4_ + *local_408;
  local_418 = -1;
  if (0.0 < *local_408) {
    local_418 = 1;
  }
  if (*(float *)(in_RDI + 0x18) < (float)local_418 * *local_408) {
    auVar31 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDI + 0x18)),ZEXT416((uint)(float)local_418),
                              ZEXT416((uint)-*local_408));
    fVar1 = *(float *)(in_RDI + 0x14);
    dVar29 = std::sqrt((double)(ulong)(uint)*local_400);
    auVar31._0_4_ =
         auVar31._0_4_ /
         ((fVar1 + SUB84(dVar29,0)) / *(float *)(in_RDI + 0x10) + *(float *)(in_RDI + 0x1c));
    auVar31._4_12_ = SUB6012((undefined1  [60])0x0,0);
    *local_3f8 = auVar31._0_4_;
  }
  else {
    auVar31 = (undefined1  [16])0x0;
    *local_3f8 = 0.0;
  }
  local_41c = Model::get_aligned_k((Model *)0x13fbb3);
  iVar19 = Model::get_aligned_k((Model *)0x13fbc7);
  auVar31 = vcvtusi2ss_avx512f(auVar31,iVar19);
  rVar27 = Model::GetAuxiliarySize(local_390);
  local_420 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar31._0_4_ * rVar27)));
  local_2dc = local_394;
  local_2f8 = local_394;
  fStack_2f4 = local_394;
  fStack_2f0 = local_394;
  fStack_2ec = local_394;
  local_438 = CONCAT44(local_394,local_394);
  uStack_430 = CONCAT44(local_394,local_394);
  local_318 = *(undefined4 *)(in_RDI + 0x10);
  local_448 = CONCAT44(local_318,local_318);
  uStack_440 = CONCAT44(local_318,local_318);
  local_338 = *(undefined4 *)(in_RDI + 0x1c);
  local_458 = CONCAT44(local_338,local_338);
  uStack_450 = CONCAT44(local_338,local_338);
  local_474 = 0;
  uStack_334 = local_338;
  uStack_330 = local_338;
  uStack_32c = local_338;
  local_31c = local_338;
  uStack_314 = local_318;
  uStack_310 = local_318;
  uStack_30c = local_318;
  local_2fc = local_318;
  std::allocator<float>::allocator((allocator<float> *)0x13fcd5);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
             (value_type_conflict *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
             (allocator_type *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  std::allocator<float>::~allocator((allocator<float> *)0x13fd09);
  local_490 = std::vector<float,_std::allocator<float>_>::data
                        ((vector<float,_std::allocator<float>_> *)0x13fd16);
  local_498._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                          CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  while( true ) {
    local_4a0 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                                   CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    bVar18 = __gnu_cxx::operator!=
                       ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                        (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    if (!bVar18) break;
    pNVar20 = __gnu_cxx::
              __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
              ::operator->(&local_498);
    local_4a4 = pNVar20->feat_id;
    if (local_4a4 < local_3ac) {
      pNVar20 = __gnu_cxx::
                __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                ::operator->(&local_498);
      local_4a8 = pNVar20->feat_val;
      local_4b0 = Model::GetParameter_v(local_390);
      local_4b0 = local_4b0 + local_4a4 * local_420;
      local_358 = local_4a8 * local_398;
      local_4c8 = CONCAT44(local_358,local_358);
      uStack_4c0 = CONCAT44(local_358,local_358);
      for (local_4cc = 0; fStack_354 = local_358, fStack_350 = local_358, fStack_34c = local_358,
          local_33c = local_358, local_4cc < local_41c; local_4cc = local_4cc + 4) {
        local_2b0 = local_490 + local_4cc;
        uVar4 = *(undefined8 *)local_2b0;
        uVar5 = *(undefined8 *)(local_2b0 + 2);
        local_2b8 = local_4b0 + local_4cc;
        local_4f8 = *(undefined8 *)local_2b8;
        uStack_4f0 = *(undefined8 *)(local_2b8 + 2);
        local_118._0_4_ = (float)local_4f8;
        local_118._4_4_ = (float)((ulong)local_4f8 >> 0x20);
        uStack_110._0_4_ = (float)uStack_4f0;
        uStack_110._4_4_ = (float)((ulong)uStack_4f0 >> 0x20);
        local_228 = CONCAT44(local_118._4_4_ * local_358,(float)local_118 * local_358);
        uStack_220 = CONCAT44(uStack_110._4_4_ * local_358,(float)uStack_110 * local_358);
        local_218._0_4_ = (float)uVar4;
        local_218._4_4_ = (float)((ulong)uVar4 >> 0x20);
        uStack_210._0_4_ = (float)uVar5;
        uStack_210._4_4_ = (float)((ulong)uVar5 >> 0x20);
        local_4e8 = CONCAT44(local_218._4_4_ + local_118._4_4_ * local_358,
                             (float)local_218 + (float)local_118 * local_358);
        uStack_4e0 = CONCAT44(uStack_210._4_4_ + uStack_110._4_4_ * local_358,
                              (float)uStack_210 + (float)uStack_110 * local_358);
        local_b0 = local_490 + local_4cc;
        *(undefined8 *)local_b0 = local_4e8;
        *(undefined8 *)(local_b0 + 2) = uStack_4e0;
        local_218 = uVar4;
        uStack_210 = uVar5;
        local_128 = local_4c8;
        uStack_120 = uStack_4c0;
        local_118 = local_4f8;
        uStack_110 = uStack_4f0;
        local_c8 = local_4e8;
        uStack_c0 = uStack_4e0;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_498);
  }
  local_500._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
                          CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  while( true ) {
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
              ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
               CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    bVar18 = __gnu_cxx::operator!=
                       ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                        (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    if (!bVar18) break;
    pNVar20 = __gnu_cxx::
              __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
              ::operator->(&local_500);
    uVar25 = pNVar20->feat_id;
    if (uVar25 < local_3ac) {
      pNVar20 = __gnu_cxx::
                __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                ::operator->(&local_500);
      fVar1 = pNVar20->feat_val;
      prVar21 = Model::GetParameter_v(local_390);
      uVar25 = uVar25 * local_420;
      fVar1 = fVar1 * local_398;
      local_138 = local_438;
      uVar4 = local_138;
      uStack_130 = uStack_430;
      uVar5 = uStack_130;
      local_138._0_4_ = (float)local_438;
      local_138._4_4_ = (float)((ulong)local_438 >> 0x20);
      uStack_130._0_4_ = (float)uStack_430;
      uStack_130._4_4_ = (float)((ulong)uStack_430 >> 0x20);
      fVar28 = (float)local_138 * fVar1;
      fVar32 = local_138._4_4_ * fVar1;
      fVar33 = (float)uStack_130 * fVar1;
      fVar34 = uStack_130._4_4_ * fVar1;
      local_378 = fVar1;
      fStack_374 = fVar1;
      fStack_370 = fVar1;
      fStack_36c = fVar1;
      local_35c = fVar1;
      local_148 = CONCAT44(fVar1,fVar1);
      uStack_140 = CONCAT44(fVar1,fVar1);
      local_138 = uVar4;
      uStack_130 = uVar5;
      for (local_53c = 0; local_53c < local_41c; local_53c = local_53c + 4) {
        prVar22 = prVar21 + (ulong)uVar25 + (ulong)local_53c;
        pauVar23 = (undefined1 (*) [16])
                   (prVar21 + (ulong)uVar25 + (ulong)local_41c + (ulong)local_53c);
        prVar24 = prVar21 + (ulong)uVar25 + (ulong)(local_41c << 1) + (ulong)local_53c;
        local_2c0 = (undefined1 (*) [16])(local_490 + local_53c);
        local_58 = *(undefined8 *)*local_2c0;
        uStack_50 = *(undefined8 *)(*local_2c0 + 8);
        local_1e8 = *(undefined8 *)prVar22;
        uStack_1e0 = *(undefined8 *)(prVar22 + 2);
        local_298 = *(undefined8 *)*pauVar23;
        uStack_290 = *(undefined8 *)(*pauVar23 + 8);
        uVar4 = *(undefined8 *)prVar24;
        uVar5 = *(undefined8 *)(prVar24 + 2);
        local_158 = local_458;
        uVar16 = local_158;
        uStack_150 = uStack_450;
        uVar17 = uStack_150;
        local_158._0_4_ = (float)local_458;
        local_158._4_4_ = (float)((ulong)local_458 >> 0x20);
        uStack_150._0_4_ = (float)uStack_450;
        uStack_150._4_4_ = (float)((ulong)uStack_450 >> 0x20);
        local_168._0_4_ = (float)local_1e8;
        local_168._4_4_ = (float)((ulong)local_1e8 >> 0x20);
        uStack_160._0_4_ = (float)uStack_1e0;
        uStack_160._4_4_ = (float)((ulong)uStack_1e0 >> 0x20);
        local_68 = CONCAT44(local_168._4_4_ * fVar1,(float)local_168 * fVar1);
        uStack_60 = CONCAT44(uStack_160._4_4_ * fVar1,(float)uStack_160 * fVar1);
        auVar7._8_8_ = uStack_60;
        auVar7._0_8_ = local_68;
        auVar31 = vsubps_avx(*local_2c0,auVar7);
        local_738 = auVar31._0_8_;
        uStack_730 = auVar31._8_8_;
        local_1a8 = local_738;
        uVar14 = local_1a8;
        uStack_1a0 = uStack_730;
        uVar15 = uStack_1a0;
        local_1a8._0_4_ = auVar31._0_4_;
        local_1a8._4_4_ = auVar31._4_4_;
        uStack_1a0._0_4_ = auVar31._8_4_;
        uStack_1a0._4_4_ = auVar31._12_4_;
        local_1a8._0_4_ = fVar28 * (float)local_1a8;
        local_1a8._4_4_ = fVar32 * local_1a8._4_4_;
        uStack_1a0._0_4_ = fVar33 * (float)uStack_1a0;
        uStack_1a0._4_4_ = fVar34 * uStack_1a0._4_4_;
        local_248 = CONCAT44(local_1a8._4_4_,(float)local_1a8);
        uStack_240 = CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0);
        local_238 = CONCAT44(local_158._4_4_ * local_168._4_4_,(float)local_158 * (float)local_168);
        uStack_230 = CONCAT44(uStack_150._4_4_ * uStack_160._4_4_,
                              (float)uStack_150 * (float)uStack_160);
        local_1a8._0_4_ = (float)local_158 * (float)local_168 + (float)local_1a8;
        local_1a8._4_4_ = local_158._4_4_ * local_168._4_4_ + local_1a8._4_4_;
        uStack_1a0._0_4_ = (float)uStack_150 * (float)uStack_160 + (float)uStack_1a0;
        uStack_1a0._4_4_ = uStack_150._4_4_ * uStack_160._4_4_ + uStack_1a0._4_4_;
        local_208 = CONCAT44(local_1a8._4_4_,(float)local_1a8);
        uStack_200 = CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0);
        local_268 = CONCAT44(local_1a8._4_4_ * local_1a8._4_4_,(float)local_1a8 * (float)local_1a8);
        uStack_260 = CONCAT44(uStack_1a0._4_4_ * uStack_1a0._4_4_,
                              (float)uStack_1a0 * (float)uStack_1a0);
        local_258._0_4_ = (float)local_298;
        local_258._4_4_ = (float)((ulong)local_298 >> 0x20);
        uStack_250._0_4_ = (float)uStack_290;
        uStack_250._4_4_ = (float)((ulong)uStack_290 >> 0x20);
        local_18 = CONCAT44(local_258._4_4_ + local_1a8._4_4_ * local_1a8._4_4_,
                            (float)local_258 + (float)local_1a8 * (float)local_1a8);
        uStack_10 = CONCAT44(uStack_250._4_4_ + uStack_1a0._4_4_ * uStack_1a0._4_4_,
                             (float)uStack_250 + (float)uStack_1a0 * (float)uStack_1a0);
        auVar9._8_8_ = uStack_10;
        auVar9._0_8_ = local_18;
        auVar31 = vsqrtps_avx(auVar9);
        auVar3 = vsqrtps_avx(*pauVar23);
        local_7a8 = auVar3._0_8_;
        uStack_7a0 = auVar3._8_8_;
        local_798 = auVar31._0_8_;
        uStack_790 = auVar31._8_8_;
        local_78 = local_798;
        uStack_70 = uStack_790;
        local_88 = local_7a8;
        uStack_80 = uStack_7a0;
        auVar31 = vsubps_avx(auVar31,auVar3);
        local_7b8 = auVar31._0_8_;
        uStack_7b0 = auVar31._8_8_;
        local_38 = local_7b8;
        uStack_30 = uStack_7b0;
        local_48 = local_448;
        uStack_40 = uStack_440;
        auVar8._8_8_ = uStack_440;
        auVar8._0_8_ = local_448;
        auVar31 = vdivps_avx(auVar31,auVar8);
        local_7c8 = auVar31._0_8_;
        uStack_7c0 = auVar31._8_8_;
        local_1d8 = local_7c8;
        uVar12 = local_1d8;
        uStack_1d0 = uStack_7c0;
        uVar13 = uStack_1d0;
        local_1d8._0_4_ = auVar31._0_4_;
        local_1d8._4_4_ = auVar31._4_4_;
        uStack_1d0._0_4_ = auVar31._8_4_;
        uStack_1d0._4_4_ = auVar31._12_4_;
        local_a8 = CONCAT44(local_1d8._4_4_ * local_168._4_4_,(float)local_1d8 * (float)local_168);
        uStack_a0 = CONCAT44(uStack_1d0._4_4_ * uStack_160._4_4_,
                             (float)uStack_1d0 * (float)uStack_160);
        auVar6._8_8_ = uStack_200;
        auVar6._0_8_ = local_208;
        auVar3._8_8_ = uStack_a0;
        auVar3._0_8_ = local_a8;
        auVar31 = vsubps_avx(auVar6,auVar3);
        local_808 = auVar31._0_8_;
        uStack_800 = auVar31._8_8_;
        local_288 = local_808;
        uVar10 = local_288;
        uStack_280 = uStack_800;
        uVar11 = uStack_280;
        local_278._0_4_ = (float)uVar4;
        local_278._4_4_ = (float)((ulong)uVar4 >> 0x20);
        uStack_270._0_4_ = (float)uVar5;
        uStack_270._4_4_ = (float)((ulong)uVar5 >> 0x20);
        local_288._0_4_ = auVar31._0_4_;
        local_288._4_4_ = auVar31._4_4_;
        uStack_280._0_4_ = auVar31._8_4_;
        uStack_280._4_4_ = auVar31._12_4_;
        local_e8 = CONCAT44(local_278._4_4_ + local_288._4_4_,(float)local_278 + (float)local_288);
        uStack_e0 = CONCAT44(uStack_270._4_4_ + uStack_280._4_4_,
                             (float)uStack_270 + (float)uStack_280);
        *(undefined8 *)prVar24 = local_e8;
        *(undefined8 *)(prVar24 + 2) = uStack_e0;
        local_2a8 = CONCAT44(local_1a8._4_4_ * local_1a8._4_4_,(float)local_1a8 * (float)local_1a8);
        uStack_2a0 = CONCAT44(uStack_1a0._4_4_ * uStack_1a0._4_4_,
                              (float)uStack_1a0 * (float)uStack_1a0);
        in_stack_fffffffffffff7c0 = (float)uStack_250 + (float)uStack_1a0 * (float)uStack_1a0;
        in_stack_fffffffffffff7c4 = uStack_250._4_4_ + uStack_1a0._4_4_ * uStack_1a0._4_4_;
        local_108 = CONCAT44(local_258._4_4_ + local_1a8._4_4_ * local_1a8._4_4_,
                             (float)local_258 + (float)local_1a8 * (float)local_1a8);
        uStack_100 = CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0);
        *(undefined8 *)*pauVar23 = local_108;
        *(undefined8 *)(*pauVar23 + 8) = uStack_100;
        local_2d8 = prVar24;
        local_2d0 = pauVar23;
        local_2c8 = prVar22;
        local_288 = uVar10;
        uStack_280 = uVar11;
        local_278 = uVar4;
        uStack_270 = uVar5;
        local_258 = local_298;
        uStack_250 = uStack_290;
        local_1f8 = local_208;
        uStack_1f0 = uStack_200;
        local_1d8 = uVar12;
        uStack_1d0 = uVar13;
        local_1c8 = local_208;
        uStack_1c0 = uStack_200;
        local_1b8 = local_208;
        uStack_1b0 = uStack_200;
        local_1a8 = uVar14;
        uStack_1a0 = uVar15;
        local_198 = CONCAT44(fVar32,fVar28);
        uStack_190 = CONCAT44(fVar34,fVar33);
        local_188 = CONCAT44(fVar1,fVar1);
        uStack_180 = CONCAT44(fVar1,fVar1);
        local_178 = local_1e8;
        uStack_170 = uStack_1e0;
        local_168 = local_1e8;
        uStack_160 = uStack_1e0;
        local_158 = uVar16;
        uStack_150 = uVar17;
        local_f0 = pauVar23;
        local_d0 = prVar24;
        local_98 = local_208;
        uStack_90 = uStack_200;
        local_28 = local_298;
        uStack_20 = uStack_290;
        for (local_5c0 = 0; local_5c0 < 4; local_5c0 = local_5c0 + 1) {
          fVar2 = prVar24[local_5c0];
          iVar26 = -1;
          if (0.0 < fVar2) {
            iVar26 = 1;
          }
          if (*(float *)(in_RDI + 0x18) < (float)iVar26 * fVar2) {
            in_stack_fffffffffffff7ac = *(float *)(in_RDI + 0x14);
            auVar31 = vfmsub213ss_fma(ZEXT416(*(uint *)(in_RDI + 0x18)),ZEXT416((uint)(float)iVar26)
                                      ,ZEXT416((uint)fVar2));
            in_stack_fffffffffffff7b0 = auVar31._0_4_;
            dVar29 = std::sqrt((double)(ulong)*(uint *)(*pauVar23 + local_5c0 * 4));
            in_stack_fffffffffffff7b4 = SUB84(dVar29,0);
            prVar22[local_5c0] =
                 in_stack_fffffffffffff7b0 /
                 ((in_stack_fffffffffffff7ac + in_stack_fffffffffffff7b4) /
                  *(float *)(in_RDI + 0x10) + *(float *)(in_RDI + 0x1c));
          }
          else {
            prVar22[local_5c0] = 0.0;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_500);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
  return;
}

Assistant:

void FMScore::calc_grad_ftrl(const SparseRow* row,
                             Model& model,
                             real_t pg,
                             real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }  
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMalpha = _mm_set1_ps(alpha_);
  __m128 XMML2 = _mm_set1_ps(lambda_2_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
 for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w_base = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      real_t* w = w_base + d;
      real_t* wg = w_base + aligned_k + d;
      real_t* z = w_base + aligned_k*2 + d;
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w);
      __m128 XMMwg = _mm_load_ps(wg);
      __m128 XMMz = _mm_load_ps(z);
      __m128 XMMg = _mm_add_ps(
                    _mm_mul_ps(XMML2, XMMw),
                    _mm_mul_ps(XMMpgv,
                    _mm_sub_ps(XMMs,
                      _mm_mul_ps(XMMw, XMMv))));
      __m128 XMMsigma = _mm_div_ps(
                        _mm_sub_ps(
                        _mm_sqrt_ps(
                        _mm_add_ps(XMMwg,
                        _mm_mul_ps(XMMg, XMMg))),
                        _mm_sqrt_ps(XMMwg)), XMMalpha);
      XMMz = _mm_add_ps(XMMz,
             _mm_sub_ps(XMMg,
             _mm_mul_ps(XMMsigma, XMMw)));
      _mm_store_ps(z, XMMz);
      XMMwg = _mm_add_ps(XMMwg,
              _mm_mul_ps(XMMg, XMMg));
      _mm_store_ps(wg, XMMwg);
      // Update w. SSE mat not faster.
      for (size_t i = 0; i < kAlign; ++i) {
        real_t z_value = *(z+i);
        int sign = z_value > 0 ? 1:-1;
        if (sign * z_value <= lambda_1_) {
          *(w+i) = 0;
        } else {
          *(w+i) = (sign*lambda_1_-z_value) / 
              ((beta_ + sqrt(*(wg+i))) / alpha_ + lambda_2_);
        }
      }
    }
  }
}